

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  ushort *puVar1;
  uint iFrom;
  Pgno PVar2;
  Pager *pPager;
  PgHdr *pPg;
  bool bVar3;
  int iVar4;
  DbPage *p;
  undefined7 in_register_00000011;
  byte eType_00;
  uint uVar5;
  int rc;
  MemPage *pPtrPage;
  int local_58;
  Pgno local_54;
  undefined4 local_50;
  Pgno local_4c;
  MemPage *local_48;
  BtShared *local_40;
  Pgno local_34;
  
  iFrom = pDbPage->pgno;
  local_54 = iFreePage;
  if (iFrom < 3) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10557,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    return 0xb;
  }
  local_50 = (undefined4)CONCAT71(in_register_00000011,eType);
  pPager = pBt->pPager;
  pPg = pDbPage->pDbPage;
  local_4c = iPtrPage;
  local_40 = pBt;
  if (((pPager->tempFile == '\0') || (iVar4 = sqlite3PagerWrite(pPg), iVar4 == 0)) &&
     (((pPg->flags & 2) == 0 || (iVar4 = subjournalPageIfRequired(pPg), iVar4 == 0)))) {
    local_34 = 0;
    if ((isCommit == 0) && (local_34 = 0, (pPg->flags & 8) != 0)) {
      local_34 = pPg->pgno;
    }
    pPg->flags = pPg->flags & 0xfff7;
    p = sqlite3PagerLookup(pPager,local_54);
    if (p != (DbPage *)0x0) {
      if (1 < p->nRef) {
        sqlite3PagerUnrefNotNull(p);
        iVar4 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xe1e3,
                    "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
        goto LAB_001674dc;
      }
      pPg->flags = pPg->flags | p->flags & 8;
      if (pPager->tempFile == '\0') {
        sqlite3PcacheDrop(p);
      }
      else {
        sqlite3PcacheMove(p,pPager->dbSize + 1);
      }
    }
    PVar2 = pPg->pgno;
    sqlite3PcacheMove(pPg,local_54);
    sqlite3PcacheMakeDirty(pPg);
    if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
      sqlite3PcacheMove(p,PVar2);
      sqlite3PagerUnrefNotNull(p);
    }
    PVar2 = local_34;
    eType_00 = (byte)local_50;
    if (local_34 != 0) {
      iVar4 = (*pPager->xGet)(pPager,local_34,(DbPage **)&local_48,0);
      if (iVar4 == 0) {
        puVar1 = (ushort *)((long)local_48->apOvfl + 0xc);
        *puVar1 = *puVar1 | 8;
        sqlite3PcacheMakeDirty((PgHdr *)local_48);
        sqlite3PagerUnrefNotNull((DbPage *)local_48);
      }
      else if (PVar2 <= pPager->dbOrigSize) {
        sqlite3BitvecClear(pPager->pInJournal,PVar2,pPager->pTmpSpace);
      }
      if (iVar4 != 0) goto LAB_001674e0;
    }
    iVar4 = 0;
  }
  else {
LAB_001674dc:
    eType_00 = (byte)local_50;
  }
LAB_001674e0:
  local_58 = iVar4;
  if (iVar4 == 0) {
    pDbPage->pgno = local_54;
    if ((eType_00 & 0xfb) == 1) {
      local_58 = setChildPtrmaps(pDbPage);
      if (local_58 != 0) {
        return local_58;
      }
    }
    else {
      uVar5 = *(uint *)pDbPage->aData;
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      if ((uVar5 == 0) || (ptrmapPut(local_40,uVar5,'\x04',local_54,&local_58), local_58 == 0)) {
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      if (!bVar3) {
        return local_58;
      }
    }
    if ((eType_00 != 1) && (local_58 = btreeGetPage(local_40,local_4c,&local_48,0), local_58 == 0))
    {
      iVar4 = sqlite3PagerWrite(local_48->pDbPage);
      local_58 = iVar4;
      if (iVar4 == 0) {
        iVar4 = modifyPagePointer(local_48,iFrom,local_54,eType_00);
        local_58 = iVar4;
        if (local_48 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_48->pDbPage);
        }
        if (iVar4 == 0) {
          ptrmapPut(local_40,local_54,eType_00,local_4c,&local_58);
        }
      }
      else if (local_48 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_48->pDbPage);
        local_58 = iVar4;
      }
    }
  }
  return local_58;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 || 
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %d to free page %d (ptr page %d type %d)\n", 
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}